

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QWizardDefaultProperty>::moveAppend
          (QGenericArrayOps<QWizardDefaultProperty> *this,QWizardDefaultProperty *b,
          QWizardDefaultProperty *e)

{
  qsizetype *pqVar1;
  QWizardDefaultProperty *pQVar2;
  long lVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QWizardDefaultProperty>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QWizardDefaultProperty>).size;
      pDVar4 = (b->className).d.d;
      (b->className).d.d = (Data *)0x0;
      pQVar2[lVar3].className.d.d = pDVar4;
      pcVar5 = (b->className).d.ptr;
      (b->className).d.ptr = (char *)0x0;
      pQVar2[lVar3].className.d.ptr = pcVar5;
      qVar6 = (b->className).d.size;
      (b->className).d.size = 0;
      pQVar2[lVar3].className.d.size = qVar6;
      pDVar4 = (b->property).d.d;
      (b->property).d.d = (Data *)0x0;
      pQVar2[lVar3].property.d.d = pDVar4;
      pcVar5 = (b->property).d.ptr;
      (b->property).d.ptr = (char *)0x0;
      pQVar2[lVar3].property.d.ptr = pcVar5;
      qVar6 = (b->property).d.size;
      (b->property).d.size = 0;
      pQVar2[lVar3].property.d.size = qVar6;
      pDVar4 = (b->changedSignal).d.d;
      (b->changedSignal).d.d = (Data *)0x0;
      pQVar2[lVar3].changedSignal.d.d = pDVar4;
      pcVar5 = (b->changedSignal).d.ptr;
      (b->changedSignal).d.ptr = (char *)0x0;
      pQVar2[lVar3].changedSignal.d.ptr = pcVar5;
      qVar6 = (b->changedSignal).d.size;
      (b->changedSignal).d.size = 0;
      pQVar2[lVar3].changedSignal.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QWizardDefaultProperty>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }